

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ParseSector(UDMFParser *this,sector_t_conflict *sec,int index)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  char *pcVar6;
  FDynamicColormap *pFVar7;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_24c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_248;
  FTextureID local_244;
  PalEntry local_240;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_23c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_238;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_234;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_230;
  FTextureID local_22c;
  TVector3<double> local_228;
  undefined1 local_210 [8];
  DVector3 n_1;
  undefined1 local_1e0 [8];
  DVector3 n;
  undefined1 local_1c0 [8];
  FScanner sc;
  FName local_b8;
  FName local_b4;
  char *local_b0;
  char *str_1;
  char *str;
  undefined1 local_98 [16];
  FName key;
  FString local_80;
  FString tagstring;
  double cp [4];
  double fp [4];
  uint local_30;
  uint local_2c;
  int cplaneflags;
  int fplaneflags;
  int desaturation;
  int fadecolor;
  int lightcolor;
  int index_local;
  sector_t_conflict *sec_local;
  UDMFParser *this_local;
  
  desaturation = -1;
  fplaneflags = -1;
  cplaneflags = -1;
  local_2c = 0;
  local_30 = 0;
  fp[1] = 0.0;
  fp[2] = 0.0;
  cp[3] = 0.0;
  fp[0] = 0.0;
  cp[1] = 0.0;
  cp[2] = 0.0;
  tagstring.Chars = (char *)0x0;
  cp[0] = 0.0;
  FString::FString(&local_80);
  memset(sec,0,0x218);
  sec->lightlevel = 0xa0;
  sector_t::SetXScale((sector_t *)sec,0,1.0);
  sector_t::SetYScale((sector_t *)sec,0,1.0);
  sector_t::SetXScale((sector_t *)sec,1,1.0);
  sector_t::SetYScale((sector_t *)sec,1,1.0);
  sector_t::SetAlpha((sector_t *)sec,0,1.0);
  sector_t::SetAlpha((sector_t *)sec,1,1.0);
  sec->thinglist = (AActor *)0x0;
  sec->touching_thinglist = (msecnode_t *)0x0;
  sec->render_thinglist = (msecnode_t *)0x0;
  sec->touching_renderthings = (msecnode_t *)0x0;
  sVar4 = -1;
  if ((::level.flags & 0x1000) != 0) {
    sVar4 = 0;
  }
  sec->seqType = sVar4;
  sec->nextsec = -1;
  sec->prevsec = -1;
  sec->heightsec = (sector_t_conflict *)0x0;
  sec->sectornum = index;
  sec->damageinterval = 0x20;
  sec->terrainnum[0] = -1;
  sec->terrainnum[1] = -1;
  if ((this->floordrop & 1U) != 0) {
    sec->Flags = 4;
  }
  sec->gravity = 1.0;
  sec->ZoneNumber = 0xffff;
  sec->friction = 0.90625;
  sec->movefactor = 0.03125;
  FScanner::MustGetToken((FScanner *)this,0x7b);
LAB_006145cb:
  do {
    bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = FString::IsNotEmpty(&local_80);
      if (bVar2) {
        FScanner::FScanner((FScanner *)local_1c0);
        FString::FString((FString *)&n.Z,&local_80);
        FScanner::OpenString((FScanner *)local_1c0,"tagstring",(FString *)&n.Z);
        FString::~FString((FString *)&n.Z);
        while (bVar2 = FScanner::CheckNumber((FScanner *)local_1c0), bVar2) {
          if (sc.StringLen != 0) {
            FTagManager::AddSectorTag(&tagManager,index,sc.StringLen);
          }
        }
        FScanner::~FScanner((FScanner *)local_1c0);
      }
      if (sec->damageamount == 0) {
        FNameNoInit::operator=(&sec->damagetype,NAME_None);
        sec->damageinterval = 0;
        sec->leakydamage = 0;
        sec->Flags = sec->Flags & 0xfffff87f;
      }
      if (local_2c == 0xf) {
        TVector3<double>::TVector3((TVector3<double> *)&n_1.Z,cp[3],fp[0],fp[1]);
        TVector3<double>::Unit((TVector3<double> *)local_1e0,(TVector3<double> *)&n_1.Z);
        secplane_t::set(&sec->floorplane,(double)local_1e0,n.X,n.Y,fp[2]);
      }
      else {
        dVar1 = sector_t::GetPlaneTexZ((sector_t *)sec,0);
        secplane_t::SetAtHeight(&sec->floorplane,dVar1,0);
      }
      if (local_30 == 0xf) {
        TVector3<double>::TVector3(&local_228,(double)tagstring.Chars,cp[0],cp[1]);
        TVector3<double>::Unit((TVector3<double> *)local_210,&local_228);
        secplane_t::set(&sec->ceilingplane,(double)local_210,n_1.X,n_1.Y,cp[2]);
      }
      else {
        dVar1 = sector_t::GetPlaneTexZ((sector_t *)sec,1);
        secplane_t::SetAtHeight(&sec->ceilingplane,dVar1,1);
      }
      if (((desaturation == -1) && (fplaneflags == -1)) && (cplaneflags == -1)) {
        bVar2 = false;
        if (::level.outsidefog != 0xff000000) {
          local_22c = sector_t::GetTexture((sector_t *)sec,1);
          bVar3 = FTextureID::operator==(&local_22c,&skyflatnum);
          bVar2 = true;
          if (!bVar3) {
            bVar2 = (sec->special & 0xffU) == 0x57;
          }
        }
        if (bVar2) {
          if (this->fogMap == (FDynamicColormap *)0x0) {
            PalEntry::PalEntry((PalEntry *)&local_230.field_0,0xff,0xff,0xff);
            PalEntry::PalEntry((PalEntry *)&local_234.field_0,::level.outsidefog);
            pFVar7 = GetSpecialLights((PalEntry)local_230,(PalEntry)local_234,0);
            this->fogMap = pFVar7;
          }
          sec->ColorMap = this->fogMap;
        }
        else {
          if (this->normMap == (FDynamicColormap *)0x0) {
            PalEntry::PalEntry((PalEntry *)&local_238.field_0,0xff,0xff,0xff);
            PalEntry::PalEntry((PalEntry *)&local_23c.field_0,::level.fadeto);
            pFVar7 = GetSpecialLights((PalEntry)local_238,(PalEntry)local_23c,NormalLight.Desaturate
                                     );
            this->normMap = pFVar7;
          }
          sec->ColorMap = this->normMap;
        }
      }
      else {
        if (desaturation == -1) {
          PalEntry::PalEntry(&local_240,0xff,0xff,0xff);
          desaturation = PalEntry::operator_cast_to_unsigned_int(&local_240);
        }
        if (fplaneflags == -1) {
          bVar2 = false;
          if (::level.outsidefog != 0xff000000) {
            local_244 = sector_t::GetTexture((sector_t *)sec,1);
            bVar3 = FTextureID::operator==(&local_244,&skyflatnum);
            bVar2 = true;
            if (!bVar3) {
              bVar2 = (sec->special & 0xffU) == 0x57;
            }
          }
          if (bVar2) {
            fplaneflags = ::level.outsidefog;
          }
          else {
            fplaneflags = ::level.fadeto;
          }
        }
        if (cplaneflags == -1) {
          cplaneflags = NormalLight.Desaturate;
        }
        PalEntry::PalEntry((PalEntry *)&local_248.field_0,desaturation);
        PalEntry::PalEntry((PalEntry *)&local_24c.field_0,fplaneflags);
        pFVar7 = GetSpecialLights((PalEntry)local_248,(PalEntry)local_24c,cplaneflags);
        sec->ColorMap = pFVar7;
      }
      FString::~FString(&local_80);
      return;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)(local_98 + 8),SUB81(this,0),(bool *)0x0);
    iVar5 = FName::operator_cast_to_int((FName *)(local_98 + 8));
    switch(iVar5) {
    case 0xed:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
      sec->special = (short)iVar5;
      if ((this->isTranslated & 1U) == 0) {
        bVar2 = FName::operator==(&(this->super_UDMFParserBase).namespc,NAME_Hexen);
        if ((bVar2) &&
           (((sec->special < 0 || (0xff < sec->special)) ||
            (HexenSectorSpecialOk[sec->special] == '\0')))) {
          sec->special = 0;
        }
      }
      else {
        iVar5 = P_TranslateSectorSpecial((int)sec->special);
        sec->special = (short)iVar5;
      }
      break;
    default:
      if (((this->super_UDMFParserBase).namespace_bits & 0x70U) != 0) {
        iVar5 = FName::operator_cast_to_int((FName *)(local_98 + 8));
        switch(iVar5) {
        case 0x120:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FString::operator=(&local_80,pcVar6);
          break;
        default:
          break;
        case 399:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetXOffset((sector_t *)sec,0,dVar1);
          goto LAB_006145cb;
        case 400:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetYOffset((sector_t *)sec,0,dVar1);
          goto LAB_006145cb;
        case 0x191:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetXOffset((sector_t *)sec,1,dVar1);
          goto LAB_006145cb;
        case 0x192:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetYOffset((sector_t *)sec,1,dVar1);
          goto LAB_006145cb;
        case 0x193:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetXScale((sector_t *)sec,0,dVar1);
          goto LAB_006145cb;
        case 0x194:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetYScale((sector_t *)sec,0,dVar1);
          goto LAB_006145cb;
        case 0x195:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetXScale((sector_t *)sec,1,dVar1);
          goto LAB_006145cb;
        case 0x196:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetYScale((sector_t *)sec,1,dVar1);
          goto LAB_006145cb;
        case 0x197:
          FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::CheckAngle((UDMFParserBase *)local_98,(char *)this);
          sector_t::SetAngle((sector_t *)sec,0,(DAngle *)local_98);
          goto LAB_006145cb;
        case 0x198:
          FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::CheckAngle((UDMFParserBase *)&str,(char *)this);
          sector_t::SetAngle((sector_t *)sec,1,(DAngle *)&str);
          goto LAB_006145cb;
        case 0x199:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetPlaneLight((sector_t *)sec,0,iVar5);
          goto LAB_006145cb;
        case 0x19a:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetPlaneLight((sector_t *)sec,1,iVar5);
          goto LAB_006145cb;
        case 0x19b:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          bVar2 = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar6);
          if (bVar2) {
            sector_t::ChangeFlags((sector_t *)sec,0,0,1);
          }
          else {
            sector_t::ChangeFlags((sector_t *)sec,0,1,0);
          }
          goto LAB_006145cb;
        case 0x19c:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          bVar2 = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar6);
          if (bVar2) {
            sector_t::ChangeFlags((sector_t *)sec,1,0,1);
          }
          else {
            sector_t::ChangeFlags((sector_t *)sec,1,1,0);
          }
          goto LAB_006145cb;
        case 0x19d:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sec->gravity = dVar1;
          goto LAB_006145cb;
        case 0x19e:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          desaturation = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          goto LAB_006145cb;
        case 0x19f:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          fplaneflags = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          goto LAB_006145cb;
        case 0x1a0:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          cplaneflags = (int)(dVar1 * 255.0);
          goto LAB_006145cb;
        case 0x1a1:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FNameNoInit::operator=(&sec->SeqName,pcVar6);
          sec->seqType = -1;
          goto LAB_006145cb;
        case 0x1a2:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&sec->Flags,1,pcVar6);
          goto LAB_006145cb;
        case 0x1a3:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&sec->Flags,2,pcVar6);
          goto LAB_006145cb;
        case 0x1a4:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&sec->Flags,4,pcVar6);
          goto LAB_006145cb;
        case 0x1a5:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&sec->Flags,8,pcVar6);
          goto LAB_006145cb;
        case 0x1a6:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetAlpha((sector_t *)sec,0,dVar1);
          goto LAB_006145cb;
        case 0x1a7:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          sector_t::SetAlpha((sector_t *)sec,1,dVar1);
          goto LAB_006145cb;
        case 0x1a8:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          str_1 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          iVar5 = strcasecmp(str_1,"translucent");
          if (iVar5 == 0) {
            sector_t::ChangeFlags((sector_t *)sec,0,4,0);
          }
          else {
            iVar5 = strcasecmp(str_1,"add");
            if (iVar5 == 0) {
              sector_t::ChangeFlags((sector_t *)sec,0,0,4);
            }
            else {
              FScanner::ScriptMessage
                        ((FScanner *)this,"Unknown value \"%s\" for \'renderstylefloor\'\n",str_1);
            }
          }
          goto LAB_006145cb;
        case 0x1a9:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          local_b0 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          iVar5 = strcasecmp(local_b0,"translucent");
          if (iVar5 == 0) {
            sector_t::ChangeFlags((sector_t *)sec,1,4,0);
          }
          else {
            iVar5 = strcasecmp(local_b0,"add");
            if (iVar5 == 0) {
              sector_t::ChangeFlags((sector_t *)sec,1,0,4);
            }
            else {
              FScanner::ScriptMessage
                        ((FScanner *)this,"Unknown value \"%s\" for \'renderstyleceiling\'\n",
                         local_b0);
            }
          }
          goto LAB_006145cb;
        case 0x1aa:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_short>
                    (&this->super_UDMFParserBase,&sec->MoreFlags,0x20,pcVar6);
          break;
        case 0x1ab:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[1].Flags,0x20,pcVar6);
          break;
        case 0x1ac:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[1].Flags,0x40,pcVar6);
          break;
        case 0x1ad:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[1].Flags,0x10,pcVar6);
          break;
        case 0x1ae:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[1].Flags,8,pcVar6);
          break;
        case 0x1af:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          iVar5 = strcasecmp(pcVar6,"translucent");
          if (iVar5 == 0) {
            sec->planes[1].Flags = sec->planes[1].Flags & 0xfffffffb;
          }
          else {
            pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
            pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
            iVar5 = strcasecmp(pcVar6,"additive");
            if (iVar5 == 0) {
              sec->planes[1].Flags = sec->planes[1].Flags | 4;
            }
          }
          break;
        case 0x1b1:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[0].Flags,0x20,pcVar6);
          break;
        case 0x1b2:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[0].Flags,0x40,pcVar6);
          break;
        case 0x1b3:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[0].Flags,0x10,pcVar6);
          break;
        case 0x1b4:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<int>(&this->super_UDMFParserBase,&sec->planes[0].Flags,8,pcVar6);
          break;
        case 0x1b5:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          iVar5 = strcasecmp(pcVar6,"translucent");
          if (iVar5 == 0) {
            sec->planes[0].Flags = sec->planes[0].Flags & 0xfffffffb;
          }
          else {
            pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
            pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
            iVar5 = strcasecmp(pcVar6,"additive");
            if (iVar5 == 0) {
              sec->planes[0].Flags = sec->planes[0].Flags | 4;
            }
          }
          break;
        case 0x1ca:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_short>
                    (&this->super_UDMFParserBase,&sec->MoreFlags,0x100,pcVar6);
          break;
        case 0x1ce:
          local_30 = local_30 | 1;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          tagstring.Chars = (char *)UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1cf:
          local_30 = local_30 | 2;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          cp[0] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d0:
          local_30 = local_30 | 4;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          cp[1] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d1:
          local_30 = local_30 | 8;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          cp[2] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d2:
          local_2c = local_2c | 1;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          cp[3] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d3:
          local_2c = local_2c | 2;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          fp[0] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d4:
          local_2c = local_2c | 4;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          fp[1] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d5:
          local_2c = local_2c | 8;
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          fp[2] = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
          break;
        case 0x1d6:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          sec->damageamount = iVar5;
          break;
        case 0x1d7:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FNameNoInit::operator=(&sec->damagetype,pcVar6);
          break;
        case 0x1d8:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          sec->damageinterval = (short)iVar5;
          if (sec->damageinterval < 1) {
            sec->damageinterval = 1;
          }
          break;
        case 0x1d9:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
          sec->leakydamage = (short)iVar5;
          break;
        case 0x1da:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&sec->Flags,0x80,pcVar6);
          break;
        case 0x1db:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&sec->Flags,0x400,pcVar6);
          break;
        case 0x1dc:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FName::FName(&local_b4,pcVar6);
          iVar5 = P_FindTerrain(&local_b4);
          sec->terrainnum[0] = iVar5;
          break;
        case 0x1dd:
          pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
          pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
          FName::FName(&local_b8,pcVar6);
          iVar5 = P_FindTerrain(&local_b8);
          sec->terrainnum[1] = iVar5;
        }
      }
      if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
        pcVar6 = FName::GetChars((FName *)(local_98 + 8));
        iVar5 = strncasecmp("user_",pcVar6,5);
        if (iVar5 == 0) {
          FName::FName((FName *)&sc.CMode,(FName *)(local_98 + 8));
          AddUserKey(this,(FName *)&sc.CMode,2,index);
        }
      }
      break;
    case 0x11f:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
      FTagManager::AddSectorTag(&tagManager,index,iVar5);
      break;
    case 299:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
      sector_t::SetPlaneTexZ((sector_t *)sec,0,dVar1);
      break;
    case 300:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      dVar1 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar6);
      sector_t::SetPlaneTexZ((sector_t *)sec,1,dVar1);
      break;
    case 0x12d:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      iVar5 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar6);
      sVar4 = sector_t::ClampLight(iVar5);
      sec->lightlevel = sVar4;
      break;
    case 0x12e:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
      SetTexture(sec,index,0,pcVar6,this->missingTex,false);
      break;
    case 0x12f:
      pcVar6 = FName::operator_cast_to_char_((FName *)(local_98 + 8));
      pcVar6 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar6);
      SetTexture(sec,index,1,pcVar6,this->missingTex,false);
    }
  } while( true );
}

Assistant:

void ParseSector(sector_t *sec, int index)
	{
		int lightcolor = -1;
		int fadecolor = -1;
		int desaturation = -1;
		int fplaneflags = 0, cplaneflags = 0;
		double fp[4] = { 0 }, cp[4] = { 0 };
		FString tagstring;

		memset(sec, 0, sizeof(*sec));
		sec->lightlevel = 160;
		sec->SetXScale(sector_t::floor, 1.);	// [RH] floor and ceiling scaling
		sec->SetYScale(sector_t::floor, 1.);
		sec->SetXScale(sector_t::ceiling, 1.);
		sec->SetYScale(sector_t::ceiling, 1.);
		sec->SetAlpha(sector_t::floor, 1.);
		sec->SetAlpha(sector_t::ceiling, 1.);
		sec->thinglist = nullptr;
		sec->touching_thinglist = nullptr;		// phares 3/14/98
		sec->render_thinglist = nullptr;
		sec->touching_renderthings = nullptr;
		sec->seqType = (level.flags & LEVEL_SNDSEQTOTALCTRL) ? 0 : -1;
		sec->nextsec = -1;	//jff 2/26/98 add fields to support locking out
		sec->prevsec = -1;	// stair retriggering until build completes
		sec->heightsec = NULL;	// sector used to get floor and ceiling height
		sec->sectornum = index;
		sec->damageinterval = 32;
		sec->terrainnum[sector_t::ceiling] = sec->terrainnum[sector_t::floor] = -1;
		if (floordrop) sec->Flags = SECF_FLOORDROP;
		// killough 3/7/98: end changes

		sec->gravity = 1.;	// [RH] Default sector gravity of 1.0
		sec->ZoneNumber = 0xFFFF;

		// killough 8/28/98: initialize all sectors to normal friction
		sec->friction = ORIG_FRICTION;
		sec->movefactor = ORIG_FRICTION_FACTOR;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Heightfloor:
				sec->SetPlaneTexZ(sector_t::floor, CheckFloat(key));
				continue;

			case NAME_Heightceiling:
				sec->SetPlaneTexZ(sector_t::ceiling, CheckFloat(key));
				continue;

			case NAME_Texturefloor:
				SetTexture(sec, index, sector_t::floor, CheckString(key), missingTex, false);
				continue;

			case NAME_Textureceiling:
				SetTexture(sec, index, sector_t::ceiling, CheckString(key), missingTex, false);
				continue;

			case NAME_Lightlevel:
				sec->lightlevel = sector_t::ClampLight(CheckInt(key));
				continue;

			case NAME_Special:
				sec->special = (short)CheckInt(key);
				if (isTranslated) sec->special = P_TranslateSectorSpecial(sec->special);
				else if (namespc == NAME_Hexen)
				{
					if (sec->special < 0 || sec->special > 255 || !HexenSectorSpecialOk[sec->special])
						sec->special = 0;	// NULL all unknown specials
				}
				continue;

			case NAME_Id:
				tagManager.AddSectorTag(index, CheckInt(key));
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
				case NAME_Xpanningfloor:
					sec->SetXOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Ypanningfloor:
					sec->SetYOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xpanningceiling:
					sec->SetXOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Ypanningceiling:
					sec->SetYOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Xscalefloor:
					sec->SetXScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Yscalefloor:
					sec->SetYScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xscaleceiling:
					sec->SetXScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Yscaleceiling:
					sec->SetYScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Rotationfloor:
					sec->SetAngle(sector_t::floor, CheckAngle(key));
					continue;

				case NAME_Rotationceiling:
					sec->SetAngle(sector_t::ceiling, CheckAngle(key));
					continue;

				case NAME_Lightfloor:
					sec->SetPlaneLight(sector_t::floor, CheckInt(key));
					continue;

				case NAME_Lightceiling:
					sec->SetPlaneLight(sector_t::ceiling, CheckInt(key));
					continue;

				case NAME_Alphafloor:
					sec->SetAlpha(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Alphaceiling:
					sec->SetAlpha(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Renderstylefloor:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::floor, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstylefloor'\n", str);
					continue;
				}

				case NAME_Renderstyleceiling:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::ceiling, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyleceiling'\n", str);
					continue;
				}

				case NAME_Lightfloorabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::floor, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Lightceilingabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::ceiling, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Gravity:
					sec->gravity = CheckFloat(key);
					continue;

				case NAME_Lightcolor:
					lightcolor = CheckInt(key);
					continue;

				case NAME_Fadecolor:
					fadecolor = CheckInt(key);
					continue;

				case NAME_Desaturation:
					desaturation = int(255*CheckFloat(key));
					continue;

				case NAME_Silent:
					Flag(sec->Flags, SECF_SILENT, key);
					continue;

				case NAME_NoRespawn:
					Flag(sec->Flags, SECF_NORESPAWN, key);
					continue;

				case NAME_Nofallingdamage:
					Flag(sec->Flags, SECF_NOFALLINGDAMAGE, key);
					continue;

				case NAME_Dropactors:
					Flag(sec->Flags, SECF_FLOORDROP, key);
					continue;

				case NAME_SoundSequence:
					sec->SeqName = CheckString(key);
					sec->seqType = -1;
					continue;

				case NAME_hidden:
					Flag(sec->MoreFlags, SECF_HIDDEN, key);
					break;

				case NAME_Waterzone:
					Flag(sec->MoreFlags, SECF_UNDERWATER, key);
					break;

				case NAME_floorplane_a:
					fplaneflags |= 1;
					fp[0] = CheckFloat(key);
					break;

				case NAME_floorplane_b:
					fplaneflags |= 2;
					fp[1] = CheckFloat(key);
					break;

				case NAME_floorplane_c:
					fplaneflags |= 4;
					fp[2] = CheckFloat(key);
					break;

				case NAME_floorplane_d:
					fplaneflags |= 8;
					fp[3] = CheckFloat(key);
					break;

				case NAME_ceilingplane_a:
					cplaneflags |= 1;
					cp[0] = CheckFloat(key);
					break;

				case NAME_ceilingplane_b:
					cplaneflags |= 2;
					cp[1] = CheckFloat(key);
					break;

				case NAME_ceilingplane_c:
					cplaneflags |= 4;
					cp[2] = CheckFloat(key);
					break;

				case NAME_ceilingplane_d:
					cplaneflags |= 8;
					cp[3] = CheckFloat(key);
					break;

				case NAME_damageamount:
					sec->damageamount = CheckInt(key);
					break;

				case NAME_damagetype:
					sec->damagetype = CheckString(key);
					break;

				case NAME_damageinterval:
					sec->damageinterval = CheckInt(key);
					if (sec->damageinterval < 1) sec->damageinterval = 1;
					break;

				case NAME_leakiness:
					sec->leakydamage = CheckInt(key);
					break;

				case NAME_damageterraineffect:
					Flag(sec->Flags, SECF_DMGTERRAINFX, key);
					break;

				case NAME_damagehazard:
					Flag(sec->Flags, SECF_HAZARD, key);
					break;

				case NAME_floorterrain:
					sec->terrainnum[sector_t::floor] = P_FindTerrain(CheckString(key));
					break;

				case NAME_ceilingterrain:
					sec->terrainnum[sector_t::ceiling] = P_FindTerrain(CheckString(key));
					break;

				case NAME_MoreIds:
					// delay parsing of the tag string until parsing of the sector is complete
					// This ensures that the ID is always the first tag in the list.
					tagstring = CheckString(key);
					break;

				case NAME_portal_ceil_blocksound:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_BLOCKSOUND, key);
					break;

				case NAME_portal_ceil_disabled:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_DISABLED, key);
					break;

				case NAME_portal_ceil_nopass:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_NOPASS, key);
					break;

				case NAME_portal_ceil_norender:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_NORENDER, key);
					break;

				case NAME_portal_ceil_overlaytype:
					if (!stricmp(CheckString(key), "translucent")) sec->planes[sector_t::ceiling].Flags &= ~PLANEF_ADDITIVE;
					else if (!stricmp(CheckString(key), "additive")) sec->planes[sector_t::ceiling].Flags |= PLANEF_ADDITIVE;
					break;
				
				case NAME_portal_floor_blocksound:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_BLOCKSOUND, key);
					break;

				case NAME_portal_floor_disabled:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_DISABLED, key);
					break;

				case NAME_portal_floor_nopass:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_NOPASS, key);
					break;

				case NAME_portal_floor_norender:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_NORENDER, key);
					break;

				case NAME_portal_floor_overlaytype:
					if (!stricmp(CheckString(key), "translucent")) sec->planes[sector_t::floor].Flags &= ~PLANEF_ADDITIVE;
					else if (!stricmp(CheckString(key), "additive")) sec->planes[sector_t::floor].Flags |= PLANEF_ADDITIVE;
					break;

				// These two are used by Eternity for something I do not understand.
				//case NAME_portal_ceil_useglobaltex:
				//case NAME_portal_floor_useglobaltex:
					
				default:
					break;
			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Sector, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddSectorTag(index, sc.Number);
			}
		}

		if (sec->damageamount == 0)
		{
			// If no damage is set, clear all other related properties so that they do not interfere
			// with other means of setting them.
			sec->damagetype = NAME_None;
			sec->damageinterval = 0;
			sec->leakydamage = 0;
			sec->Flags &= ~SECF_DAMAGEFLAGS;
		}
		
		// Reset the planes to their defaults if not all of the plane equation's parameters were found.
		if (fplaneflags != 15)
		{
			sec->floorplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::floor), sector_t::floor);
		}
		else
		{
			// normalize the vector, it must have a length of 1
			DVector3 n = DVector3(fp[0], fp[1], fp[2]).Unit();
			sec->floorplane.set(n.X, n.Y, n.Z, fp[3]);
		}
		if (cplaneflags != 15)
		{
			sec->ceilingplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::ceiling), sector_t::ceiling);
		}
		else
		{
			DVector3 n = DVector3(cp[0], cp[1], cp[2]).Unit();
			sec->ceilingplane.set(n.X, n.Y, n.Z, cp[3]);
		}

		if (lightcolor == -1 && fadecolor == -1 && desaturation == -1)
		{
			// [RH] Sectors default to white light with the default fade.
			//		If they are outside (have a sky ceiling), they use the outside fog.
			if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
			{
				if (fogMap == NULL)
					fogMap = GetSpecialLights(PalEntry(255, 255, 255), level.outsidefog, 0);
				sec->ColorMap = fogMap;
			}
			else
			{
				if (normMap == NULL)
					normMap = GetSpecialLights (PalEntry (255,255,255), level.fadeto, NormalLight.Desaturate);
				sec->ColorMap = normMap;
			}
		}
		else
		{
			if (lightcolor == -1) lightcolor = PalEntry(255,255,255);
			if (fadecolor == -1)
			{
				if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
					fadecolor = level.outsidefog;
				else
					fadecolor = level.fadeto;
			}
			if (desaturation == -1) desaturation = NormalLight.Desaturate;

			sec->ColorMap = GetSpecialLights (lightcolor, fadecolor, desaturation);
		}
	}